

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

bool __thiscall flatbuffers::java::JavaGenerator::generate(JavaGenerator *this)

{
  EnumDef *enum_def_00;
  bool bVar1;
  reference ppEVar2;
  reference ppSVar3;
  undefined1 local_118 [8];
  string class_name_1;
  StructDef *struct_def;
  string declcode;
  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_c8;
  const_iterator it_1;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> class_name;
  EnumDef *enum_def;
  string enumcode;
  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_40;
  const_iterator it;
  string one_file_code;
  JavaGenerator *this_local;
  
  std::__cxx11::string::string((string *)&it);
  this->cur_name_space_ = ((this->super_BaseGenerator).parser_)->current_namespace_;
  local_40._M_current =
       (EnumDef **)
       std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                 (&(((this->super_BaseGenerator).parser_)->enums_).vec);
  while( true ) {
    enumcode.field_2._8_8_ =
         std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                   (&(((this->super_BaseGenerator).parser_)->enums_).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                        *)((long)&enumcode.field_2 + 8));
    if (!bVar1) break;
    std::__cxx11::string::string((string *)&enum_def);
    ppEVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
              ::operator*(&local_40);
    enum_def_00 = *ppEVar2;
    if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
      this->cur_name_space_ = (enum_def_00->super_Definition).defined_namespace;
    }
    GenEnum(this,enum_def_00,(string *)&enum_def);
    if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
      bVar1 = SaveType(this,(string *)enum_def_00,(enum_def_00->super_Definition).defined_namespace,
                       (string *)&enum_def,false);
      if (bVar1) goto LAB_0029d742;
      this_local._7_1_ = 0;
      class_name.field_2._8_4_ = 1;
    }
    else {
      std::__cxx11::string::operator+=((string *)&it,(string *)&enum_def);
LAB_0029d742:
      if ((((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) &&
         ((enum_def_00->is_union & 1U) != 0)) {
        std::__cxx11::string::operator=((string *)&enum_def,"");
        GenEnum_ObjectAPI(this,enum_def_00,(string *)&enum_def);
        IdlNamer::Type_abi_cxx11_((string *)&it_1,&this->namer_,enum_def_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                       "Union");
        std::__cxx11::string::~string((string *)&it_1);
        if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
          bVar1 = SaveType(this,(string *)local_a0,(enum_def_00->super_Definition).defined_namespace
                           ,(string *)&enum_def,false);
          if (bVar1) goto LAB_0029d885;
          this_local._7_1_ = 0;
          class_name.field_2._8_4_ = 1;
        }
        else {
          std::__cxx11::string::operator+=((string *)&it,(string *)&enum_def);
LAB_0029d885:
          class_name.field_2._8_4_ = 0;
        }
        std::__cxx11::string::~string((string *)local_a0);
        if (class_name.field_2._8_4_ != 0) goto LAB_0029d8aa;
      }
      class_name.field_2._8_4_ = 0;
    }
LAB_0029d8aa:
    std::__cxx11::string::~string((string *)&enum_def);
    if (class_name.field_2._8_4_ != 0) goto LAB_0029dc12;
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
    ::operator++(&local_40);
  }
  local_c8._M_current =
       (StructDef **)
       std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                 (&(((this->super_BaseGenerator).parser_)->structs_).vec);
  while( true ) {
    declcode.field_2._8_8_ =
         std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::end
                   (&(((this->super_BaseGenerator).parser_)->structs_).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_c8,
                       (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                        *)((long)&declcode.field_2 + 8));
    if (!bVar1) break;
    std::__cxx11::string::string((string *)&struct_def);
    ppSVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              ::operator*(&local_c8);
    class_name_1.field_2._8_8_ = *ppSVar3;
    if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
      this->cur_name_space_ =
           (((StructDef *)class_name_1.field_2._8_8_)->super_Definition).defined_namespace;
    }
    GenStruct(this,(StructDef *)class_name_1.field_2._8_8_,(string *)&struct_def,
              &((this->super_BaseGenerator).parser_)->opts);
    if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
      bVar1 = SaveType(this,(string *)class_name_1.field_2._8_8_,
                       *(Namespace **)(class_name_1.field_2._8_8_ + 0xa8),(string *)&struct_def,true
                      );
      if (bVar1) goto LAB_0029da40;
      this_local._7_1_ = 0;
      class_name.field_2._8_4_ = 1;
    }
    else {
      std::__cxx11::string::operator+=((string *)&it,(string *)&struct_def);
LAB_0029da40:
      if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) {
        std::__cxx11::string::operator=((string *)&struct_def,"");
        GenStruct_ObjectAPI(this,(StructDef *)class_name_1.field_2._8_8_,(string *)&struct_def);
        IdlNamer::ObjectType_abi_cxx11_
                  ((string *)local_118,&this->namer_,(StructDef *)class_name_1.field_2._8_8_);
        if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
          bVar1 = SaveType(this,(string *)local_118,
                           *(Namespace **)(class_name_1.field_2._8_8_ + 0xa8),(string *)&struct_def,
                           true);
          if (bVar1) goto LAB_0029db42;
          this_local._7_1_ = 0;
          class_name.field_2._8_4_ = 1;
        }
        else {
          std::__cxx11::string::operator+=((string *)&it,(string *)&struct_def);
LAB_0029db42:
          class_name.field_2._8_4_ = 0;
        }
        std::__cxx11::string::~string((string *)local_118);
        if (class_name.field_2._8_4_ != 0) goto LAB_0029db67;
      }
      class_name.field_2._8_4_ = 0;
    }
LAB_0029db67:
    std::__cxx11::string::~string((string *)&struct_def);
    if (class_name.field_2._8_4_ != 0) goto LAB_0029dc12;
    __gnu_cxx::
    __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
    ::operator++(&local_c8);
  }
  if (((((this->super_BaseGenerator).parser_)->opts).one_file & 1U) == 0) {
    this_local._7_1_ = 1;
    class_name.field_2._8_4_ = 1;
  }
  else {
    this_local._7_1_ =
         SaveType(this,(this->super_BaseGenerator).file_name_,
                  ((this->super_BaseGenerator).parser_)->current_namespace_,(string *)&it,true);
    class_name.field_2._8_4_ = 1;
  }
LAB_0029dc12:
  std::__cxx11::string::~string((string *)&it);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool generate() {
    std::string one_file_code;
    cur_name_space_ = parser_.current_namespace_;

    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      std::string enumcode;
      auto &enum_def = **it;
      if (!parser_.opts.one_file) cur_name_space_ = enum_def.defined_namespace;
      GenEnum(enum_def, enumcode);
      if (parser_.opts.one_file) {
        one_file_code += enumcode;
      } else {
        if (!SaveType(enum_def.name, *enum_def.defined_namespace, enumcode,
                      /* needs_includes= */ false))
          return false;
      }

      if (parser_.opts.generate_object_based_api && enum_def.is_union) {
        enumcode = "";
        GenEnum_ObjectAPI(enum_def, enumcode);
        auto class_name = namer_.Type(enum_def) + "Union";
        if (parser_.opts.one_file) {
          one_file_code += enumcode;
        } else {
          if (!SaveType(class_name, *enum_def.defined_namespace, enumcode,
                        /* needs_includes= */ false))
            return false;
        }
      }
    }

    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      std::string declcode;
      auto &struct_def = **it;
      if (!parser_.opts.one_file)
        cur_name_space_ = struct_def.defined_namespace;
      GenStruct(struct_def, declcode, parser_.opts);
      if (parser_.opts.one_file) {
        one_file_code += declcode;
      } else {
        if (!SaveType(struct_def.name, *struct_def.defined_namespace, declcode,
                      /* needs_includes= */ true))
          return false;
      }

      if (parser_.opts.generate_object_based_api) {
        declcode = "";
        GenStruct_ObjectAPI(struct_def, declcode);
        auto class_name = namer_.ObjectType(struct_def);
        if (parser_.opts.one_file) {
          one_file_code += declcode;
        } else {
          if (!SaveType(class_name, *struct_def.defined_namespace, declcode,
                        /* needs_includes= */ true))
            return false;
        }
      }
    }

    if (parser_.opts.one_file) {
      return SaveType(file_name_, *parser_.current_namespace_, one_file_code,
                      /* needs_includes= */ true);
    }
    return true;
  }